

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O0

int gdImagePixelate(gdImagePtr im,int block_size,uint mode)

{
  int iVar1;
  uint local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_4c;
  int local_48;
  int cy;
  int cx;
  int total;
  int c_1;
  int b;
  int g;
  int r;
  int a;
  int c;
  int y;
  int x;
  uint mode_local;
  int block_size_local;
  gdImagePtr im_local;
  
  if (block_size < 1) {
    im_local._4_4_ = 0;
  }
  else if (block_size == 1) {
    im_local._4_4_ = 1;
  }
  else {
    if (mode == 0) {
      for (a = 0; a < im->sy; a = block_size + a) {
        for (c = 0; c < im->sx; c = block_size + c) {
          iVar1 = gdImageBoundsSafe(im,c,a);
          if (iVar1 != 0) {
            iVar1 = gdImageGetPixel(im,c,a);
            gdImageFilledRectangle(im,c,a,c + block_size + -1,a + block_size + -1,iVar1);
          }
        }
      }
    }
    else {
      if (mode != 1) {
        return 0;
      }
      for (a = 0; a < im->sy; a = block_size + a) {
        for (c = 0; c < im->sx; c = block_size + c) {
          cy = 0;
          total = 0;
          c_1 = 0;
          b = 0;
          g = 0;
          for (local_4c = 0; local_4c < block_size; local_4c = local_4c + 1) {
            for (local_48 = 0; local_48 < block_size; local_48 = local_48 + 1) {
              iVar1 = gdImageBoundsSafe(im,c + local_48,a + local_4c);
              if (iVar1 != 0) {
                local_60 = gdImageGetPixel(im,c + local_48,a + local_4c);
                if (im->trueColor == 0) {
                  local_54 = im->alpha[(int)local_60];
                }
                else {
                  local_54 = (int)(local_60 & 0x7f000000) >> 0x18;
                }
                g = local_54 + g;
                if (im->trueColor == 0) {
                  local_58 = im->red[(int)local_60];
                }
                else {
                  local_58 = (int)(local_60 & 0xff0000) >> 0x10;
                }
                b = local_58 + b;
                if (im->trueColor == 0) {
                  local_5c = im->green[(int)local_60];
                }
                else {
                  local_5c = (int)(local_60 & 0xff00) >> 8;
                }
                c_1 = local_5c + c_1;
                if (im->trueColor == 0) {
                  local_60 = im->blue[(int)local_60];
                }
                else {
                  local_60 = local_60 & 0xff;
                }
                total = local_60 + total;
                cy = cy + 1;
              }
            }
          }
          if (0 < cy) {
            iVar1 = gdImageColorResolveAlpha(im,b / cy,c_1 / cy,total / cy,g / cy);
            gdImageFilledRectangle(im,c,a,c + block_size + -1,a + block_size + -1,iVar1);
          }
        }
      }
    }
    im_local._4_4_ = 1;
  }
  return im_local._4_4_;
}

Assistant:

BGD_DECLARE(int) gdImagePixelate(gdImagePtr im, int block_size, const unsigned int mode)
{
	int x, y;

	if (block_size <= 0) {
		return 0;
	} else if (block_size == 1) {
		return 1;
	}
	switch (mode) {
	case GD_PIXELATE_UPPERLEFT:
		for (y = 0; y < im->sy; y += block_size) {
			for (x = 0; x < im->sx; x += block_size) {
				if (gdImageBoundsSafe(im, x, y)) {
					int c = gdImageGetPixel(im, x, y);
					gdImageFilledRectangle(im, x, y, x + block_size - 1, y + block_size - 1, c);
				}
			}
		}
		break;
	case GD_PIXELATE_AVERAGE:
		for (y = 0; y < im->sy; y += block_size) {
			for (x = 0; x < im->sx; x += block_size) {
				int a, r, g, b, c;
				int total;
				int cx, cy;

				a = r = g = b = c = total = 0;
				/* sampling */
				for (cy = 0; cy < block_size; cy++) {
					for (cx = 0; cx < block_size; cx++) {
						if (!gdImageBoundsSafe(im, x + cx, y + cy)) {
							continue;
						}
						c = gdImageGetPixel(im, x + cx, y + cy);
						a += gdImageAlpha(im, c);
						r += gdImageRed(im, c);
						g += gdImageGreen(im, c);
						b += gdImageBlue(im, c);
						total++;
					}
				}
				/* drawing */
				if (total > 0) {
					c = gdImageColorResolveAlpha(im, r / total, g / total, b / total, a / total);
					gdImageFilledRectangle(im, x, y, x + block_size - 1, y + block_size - 1, c);
				}
			}
		}
		break;
	default:
		return 0;
	}
	return 1;
}